

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O2

Clause * __thiscall
Saturation::PredicateSplitPassiveClauseContainer::popSelected
          (PredicateSplitPassiveClauseContainer *this)

{
  uint *puVar1;
  int *piVar2;
  pointer puVar3;
  __uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
  _Var4;
  char cVar5;
  uint uVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var7
  ;
  pointer puVar8;
  Clause *t;
  ulong uVar9;
  iterator __begin2;
  pointer puVar10;
  ulong uVar11;
  bool bVar12;
  
  if (this->_randomize == true) {
    uVar6 = Lib::Random::getInteger(this->_ratioSum);
    uVar11 = 0;
    while( true ) {
      puVar1 = (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar11;
      bVar12 = uVar6 < *puVar1;
      uVar6 = uVar6 - *puVar1;
      if (bVar12) break;
      uVar11 = (ulong)((int)uVar11 + 1);
    }
  }
  else {
    _Var7 = std::
            __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((this->_balances).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_balances).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    uVar6 = *_Var7._M_current;
    puVar10 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)_Var7._M_current - (long)puVar10 & 0x3fffffffc;
    uVar11 = (long)_Var7._M_current - (long)puVar10 >> 2;
    piVar2 = (int *)((long)puVar10 + uVar9);
    *piVar2 = *piVar2 + *(int *)((long)(this->_invertedRatios).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar9);
    puVar3 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      *puVar10 = *puVar10 - uVar6;
    }
  }
  uVar6 = (uint)uVar11;
  uVar9 = uVar11 & 0xffffffff;
  do {
    uVar11 = uVar9;
    puVar8 = (this->_queues).
             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(this->_queues).
                  super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3;
    if ((long)uVar9 <= (long)uVar11) goto LAB_00504431;
    cVar5 = (**(code **)(*(long *)puVar8[uVar11]._M_t.
                                  super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                  ._M_t + 0x28))();
    uVar9 = (ulong)((int)uVar11 + 1);
  } while (cVar5 != '\0');
  puVar8 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3;
LAB_00504431:
  if (uVar9 == uVar11) {
    do {
      uVar6 = uVar6 - 1;
      uVar11 = (ulong)uVar6;
      cVar5 = (**(code **)(*(long *)(this->_queues).
                                    super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                                    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    ._M_t + 0x28))();
    } while (cVar5 != '\0');
    puVar8 = (this->_queues).
             super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  t = (Clause *)
      (**(code **)(*(long *)puVar8[uVar11]._M_t.
                            super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                            ._M_t + 0x30))();
  if (this->_layeredArrangement == true) {
    uVar6 = 0;
    while( true ) {
      puVar8 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_queues).
                        super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3) <=
          (ulong)uVar6) break;
      _Var4._M_t.
      super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
      .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl =
           puVar8[uVar6]._M_t.
           super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ._M_t;
      (**(code **)(*(long *)_Var4._M_t.
                            super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                            .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>.
                            _M_head_impl + 0x20))
                (_Var4._M_t.
                 super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl,t)
      ;
      uVar6 = uVar6 + 1;
    }
  }
  Lib::SingleParamEvent<Kernel::Clause_*>::fire
            (&(this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
              super_ClauseContainer.selectedEvent,t);
  return t;
}

Assistant:

Clause* PredicateSplitPassiveClauseContainer::popSelected()
{
  unsigned queueIndex;

  if (_randomize) {
    unsigned toss = Random::getInteger(_ratioSum);
    // cout << "metaqueue " << _name << " toss " << toss << " (below: " << _ratioSum << ")";
    queueIndex = 0;
    while (toss >= _ratios[queueIndex]) {
      toss -= _ratios[queueIndex];
      queueIndex++;
    }
    // cout << " means " << queueIndex << " (below: " << _ratios.size() << ")" << endl;
  } else {
    // compute queue from which we will pick a clause:
    // choose queue using weighted round robin
    auto minElementIt = std::min_element(_balances.begin(), _balances.end());
    auto minElement = *minElementIt; // need to save the value of the min element before updating it to a new value, since it may not remain the minimal element after the update

    queueIndex = std::distance(_balances.begin(), minElementIt);

    _balances[queueIndex] += _invertedRatios[queueIndex];
    for (auto& balance : _balances)
    {
      balance -= minElement;
    }
  }

  // if chosen queue is empty, use the next queue to the right
  // this succeeds in a multi-split-queue-non-LRS-setting where we have the invariant that each clause from queue i is contained in queue j if i<j
  auto currIndex = queueIndex;
  while (currIndex < (long int)_queues.size() && _queues[currIndex]->isEmpty())
  {
    currIndex++;
  }
  // for tammet-style-queues or in the presence of LRS, we need to also consider the queues to the left as additional fallback (using the invar: at least one queue has at least one clause if popSelected is called)
  if (currIndex == (long int)_queues.size())
  {
    // fallback: try remaining queues, at least one of them must be nonempty
    ASS(queueIndex > 0); // otherwise we would already have searched through all queues
    currIndex = queueIndex - 1;
    while (_queues[currIndex]->isEmpty())
    {
      currIndex--;
      ASS(currIndex >= 0);
    }
  }
  ASS(!_queues[currIndex]->isEmpty());

  // pop clause from selected queue
  auto cl = _queues[currIndex]->popSelected();
  ASS(cl->store() == Clause::PASSIVE);

  // note: for a non-layered arrangement, the clause only occured in _queues[currIndex] (from which it was just removed using popSelected(), so we don't need any additional clause-removal
  if (_layeredArrangement)
  {
    // remove clause from all queues
    for (unsigned i = 0; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }

  selectedEvent.fire(cl);

  return cl;
}